

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso8859_14.h
# Opt level: O0

int iso8859_14_wctomb(void *conv,uchar *r,uint wc,int n)

{
  uchar local_29;
  uchar c;
  int n_local;
  uint wc_local;
  uchar *r_local;
  void *conv_local;
  
  local_29 = '\0';
  if (wc < 0xa0) {
    *r = (uchar)wc;
    conv_local._4_4_ = 1;
  }
  else {
    if ((wc < 0xa0) || (0xff < wc)) {
      if ((wc < 0x108) || (0x127 < wc)) {
        if ((wc < 0x170) || (0x17f < wc)) {
          if ((wc < 0x1e00) || (0x1e87 < wc)) {
            if ((0x1eef < wc) && (wc < 0x1ef8)) {
              local_29 = ""[wc - 0x1ef0];
            }
          }
          else {
            local_29 = ""[wc - 0x1e00];
          }
        }
        else {
          local_29 = ""[wc - 0x170];
        }
      }
      else {
        local_29 = ""[wc - 0x108];
      }
    }
    else {
      local_29 = iso8859_14_page00[wc - 0xa0];
    }
    if (local_29 == '\0') {
      conv_local._4_4_ = -1;
    }
    else {
      *r = local_29;
      conv_local._4_4_ = 1;
    }
  }
  return conv_local._4_4_;
}

Assistant:

static int
iso8859_14_wctomb (conv_t conv, unsigned char *r, ucs4_t wc, int n)
{
  unsigned char c = 0;
  if (wc < 0x00a0) {
    *r = wc;
    return 1;
  }
  else if (wc >= 0x00a0 && wc < 0x0100)
    c = iso8859_14_page00[wc-0x00a0];
  else if (wc >= 0x0108 && wc < 0x0128)
    c = iso8859_14_page01_0[wc-0x0108];
  else if (wc >= 0x0170 && wc < 0x0180)
    c = iso8859_14_page01_1[wc-0x0170];
  else if (wc >= 0x1e00 && wc < 0x1e88)
    c = iso8859_14_page1e_0[wc-0x1e00];
  else if (wc >= 0x1ef0 && wc < 0x1ef8)
    c = iso8859_14_page1e_1[wc-0x1ef0];
  if (c != 0) {
    *r = c;
    return 1;
  }
  return RET_ILSEQ;
}